

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall World::AdminRequest(World *this,Character *from,string *message)

{
  pointer ppCVar1;
  Character *pCVar2;
  World *pWVar3;
  Board *pBVar4;
  World *pWVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  Board_Post *this_00;
  pointer ppCVar12;
  double dVar13;
  allocator<char> local_129;
  key_type local_128;
  World *local_108;
  Board_Post *newpost;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string *local_d8;
  Character *local_d0;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  PacketBuilder builder;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"ChatMaxWidth",(allocator<char> *)&newpost);
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->config,&local_128);
  iVar7 = util::variant::GetInt(pmVar10);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_a0,from);
  util::ucfirst(&local_80,&local_a0);
  std::operator+(&local_f8,&local_80,"  needs help: ");
  iVar8 = util::text_width(&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"...",&local_129);
  util::text_cap((string *)&builder,message,iVar7 - iVar8,&local_c0);
  std::__cxx11::string::operator=((string *)message,(string *)&builder);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_128);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_128,from);
  PacketBuilder::PacketBuilder
            (&builder,PACKET_ADMININTERACT,PACKET_REPLY,
             message->_M_string_length + local_128._M_string_length + 4);
  std::__cxx11::string::~string((string *)&local_128);
  PacketBuilder::AddChar(&builder,1);
  PacketBuilder::AddByte(&builder,0xff);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_128,from);
  PacketBuilder::AddBreakString(&builder,&local_128,0xff);
  std::__cxx11::string::~string((string *)&local_128);
  PacketBuilder::AddBreakString(&builder,message,0xff);
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_c8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->admin_config;
  local_108 = this;
  local_d8 = message;
  local_d0 = from;
  for (ppCVar12 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; pWVar5 = local_108, ppCVar12 != ppCVar1;
      ppCVar12 = ppCVar12 + 1) {
    pCVar2 = *ppCVar12;
    uVar9 = (**(pCVar2->super_Command_Source)._vptr_Command_Source)(pCVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"reports",(allocator<char> *)&local_f8);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](local_c8,&local_128);
    iVar7 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&local_128);
    if (iVar7 <= (int)(uVar9 & 0xff)) {
      Character::Send(pCVar2,&builder);
    }
  }
  pWVar3 = local_108->server->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"AdminBoard",(allocator<char> *)&local_f8);
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,&local_128);
  iVar7 = util::variant::GetInt(pmVar10);
  std::__cxx11::string::~string((string *)&local_128);
  uVar11 = (ulong)(short)((short)iVar7 + -1);
  if (uVar11 < 8) {
    pBVar4 = (pWVar5->server->world->boards)._M_elems[uVar11];
    this_00 = (Board_Post *)operator_new(0x78);
    Board_Post::Board_Post(this_00);
    pCVar2 = local_d0;
    sVar6 = (short)*(undefined4 *)&pBVar4->last_id + 1;
    pBVar4->last_id = sVar6;
    this_00->id = sVar6;
    newpost = this_00;
    (*(local_d0->super_Command_Source)._vptr_Command_Source[2])(&local_128,local_d0);
    std::__cxx11::string::operator=((string *)&this_00->author,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    this_00->author_admin = (uint)pCVar2->admin;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," [Request] ",&local_129)
    ;
    (*(pCVar2->super_Command_Source)._vptr_Command_Source[2])(&local_c0,pCVar2);
    util::ucfirst(&local_a0,&local_c0);
    std::operator+(&local_f8,&local_80,&local_a0);
    std::operator+(&local_128,&local_f8," needs help");
    std::__cxx11::string::operator=((string *)&this_00->subject,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::_M_assign((string *)&this_00->body);
    dVar13 = Timer::GetTime();
    this_00->time = dVar13;
    std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::push_front
              (&pBVar4->posts,&newpost);
    uVar11 = (pBVar4->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
             _M_node._M_size;
    pWVar5 = local_108->server->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"AdminBoardLimit",(allocator<char> *)&local_f8);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar5->config,&local_128);
    iVar7 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&local_128);
    if ((ulong)(long)iVar7 < uVar11) {
      std::__cxx11::list<Board_Post_*,_std::allocator<Board_Post_*>_>::pop_back(&pBVar4->posts);
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void World::AdminRequest(Character *from, std::string message)
{
	message = util::text_cap(message, static_cast<int>(this->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  needs help: "));

	PacketBuilder builder(PACKET_ADMININTERACT, PACKET_REPLY, 4 + from->SourceName().length() + message.length());
	builder.AddChar(1); // message type
	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddBreakString(message);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceAccess() >= static_cast<int>(this->admin_config["reports"]))
		{
			character->Send(builder);
		}
	}

	short boardid = static_cast<int>(this->server->world->config["AdminBoard"]) - 1;

	if (static_cast<std::size_t>(boardid) < this->server->world->boards.size())
	{
		Board *admin_board = this->server->world->boards[boardid];

		Board_Post *newpost = new Board_Post;
		newpost->id = ++admin_board->last_id;
		newpost->author = from->SourceName();
		newpost->author_admin = from->admin;
		newpost->subject = std::string(" [Request] ") + util::ucfirst(from->SourceName()) + " needs help";
		newpost->body = message;
		newpost->time = Timer::GetTime();

		admin_board->posts.push_front(newpost);

		if (admin_board->posts.size() > static_cast<std::size_t>(static_cast<int>(this->server->world->config["AdminBoardLimit"])))
		{
			admin_board->posts.pop_back();
		}
	}
}